

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O2

Expression __thiscall
dynet::expr::detail::f<dynet::AffineTransform,std::initializer_list<dynet::expr::Expression>>
          (detail *this,initializer_list<dynet::expr::Expression> *xs)

{
  VariableIndex *pVVar1;
  ComputationGraph *arguments;
  iterator pEVar2;
  long lVar3;
  undefined8 extraout_RDX;
  Expression EVar4;
  vector<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_> xis;
  allocator_type local_3d;
  undefined4 local_3c;
  pointer local_38;
  
  arguments = xs->_M_array->pg;
  std::vector<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_>::vector
            ((vector<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_> *)
             &stack0xffffffffffffffc8,xs->_M_len,&local_3d);
  pEVar2 = xs->_M_array;
  for (lVar3 = xs->_M_len << 4; lVar3 != 0; lVar3 = lVar3 + -0x10) {
    pVVar1 = &pEVar2->i;
    pEVar2 = pEVar2 + 1;
    local_38->t = pVVar1->t;
    local_38 = local_38 + 1;
  }
  ComputationGraph::
  add_function<dynet::AffineTransform,std::vector<dynet::VariableIndex,std::allocator<dynet::VariableIndex>>>
            ((ComputationGraph *)&stack0xffffffffffffffc4,
             (vector<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_> *)arguments);
  *(ComputationGraph **)this = arguments;
  *(undefined4 *)(this + 8) = local_3c;
  std::_Vector_base<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_>::~_Vector_base
            ((_Vector_base<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_> *)
             &stack0xffffffffffffffc8);
  EVar4._8_8_ = extraout_RDX;
  EVar4.pg = (ComputationGraph *)this;
  return EVar4;
}

Assistant:

Expression f(const T& xs) {
    ComputationGraph *pg = xs.begin()->pg;
    std::vector<VariableIndex> xis(xs.size());
    int i = 0;
    for (auto xi = xs.begin(); xi != xs.end(); ++xi) xis[i++] = xi->i;
    return Expression(pg, pg->add_function<F>(xis));
  }